

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_helper.cpp
# Opt level: O0

void anon_unknown.dwarf_d8095::getDistribution
               (vector<double,_std::allocator<double>_> *data,double *mean,double *sigma)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pdVar4;
  reference pdVar5;
  double *in_RDX;
  double *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double value;
  iterator v_1;
  iterator maximumPosition;
  double maximumValue;
  uint32_t size;
  size_t sizeLimit;
  bool removed;
  const_iterator v;
  double sumSquare;
  double sum;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  vector<double,_std::allocator<double>_> *this;
  const_iterator __position;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_68;
  double local_60;
  int local_54;
  ulong local_50;
  undefined1 local_41;
  double *local_40;
  double *local_38;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_30;
  double *local_28;
  double local_20;
  double *local_18;
  double *local_10;
  vector<double,_std::allocator<double>_> *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff50);
  if (bVar1) {
    *local_18 = 0.0;
    *local_10 = 0.0;
  }
  else {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(local_8);
    if (sVar2 == 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::front
                         ((vector<double,_std::allocator<double>_> *)
                          CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      *local_10 = *pvVar3;
      *local_18 = 0.0;
    }
    else {
      local_20 = 0.0;
      local_28 = (double *)0x0;
      local_38 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
      __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
      __normal_iterator<double*>
                ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *
                 )CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                 in_stack_ffffffffffffff38);
      while( true ) {
        local_40 = (double *)
                   std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                           (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)in_stack_ffffffffffffff38);
        if (!bVar1) break;
        pdVar4 = __gnu_cxx::
                 __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_30);
        local_20 = *pdVar4 + local_20;
        pdVar4 = __gnu_cxx::
                 __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_30);
        dVar6 = *pdVar4;
        pdVar4 = __gnu_cxx::
                 __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_30);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar6;
        in_ZMM1 = ZEXT1664(auVar11);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *pdVar4;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_28;
        auVar8 = vfmadd213sd_fma(auVar7,auVar11,auVar15);
        local_28 = auVar8._0_8_;
        __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
        ::operator++(&local_30);
      }
      local_41 = 0;
      sVar2 = std::vector<double,_std::allocator<double>_>::size(local_8);
      local_50 = sVar2 * 3 >> 2;
      do {
        auVar8 = in_ZMM1._0_16_;
        sVar2 = std::vector<double,_std::allocator<double>_>::size(local_8);
        local_54 = (int)sVar2;
        auVar8 = vcvtusi2sd_avx512f(auVar8,local_54);
        *local_10 = local_20 / auVar8._0_8_;
        auVar8 = vcvtusi2sd_avx512f(auVar8,local_54);
        auVar16._0_8_ = (double)local_28 / auVar8._0_8_;
        auVar16._8_8_ = 0;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *local_10;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = -*local_10;
        auVar16 = vfmadd213sd_fma(auVar8,auVar12,auVar16);
        auVar8 = vcvtusi2sd_avx512f(auVar12,local_54);
        auVar12 = vcvtusi2sd_avx512f(auVar8,local_54 + -1);
        dVar6 = sqrt((auVar16._0_8_ * auVar8._0_8_) / auVar12._0_8_);
        *local_18 = dVar6;
        local_60 = 0.0;
        local_68._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
        local_70._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
        while( true ) {
          std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                              *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                              *)in_stack_ffffffffffffff38);
          dVar6 = local_20;
          if (!bVar1) break;
          pdVar5 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator*(&local_70);
          auVar13._8_8_ = 0x7fffffffffffffff;
          auVar13._0_8_ = 0x7fffffffffffffff;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *pdVar5 - *local_10;
          auVar8 = vpand_avx(auVar9,auVar13);
          if (local_60 < auVar8._0_8_) {
            local_68._M_current = local_70._M_current;
            local_60 = auVar8._0_8_;
          }
          __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator++(&local_70);
        }
        in_ZMM1 = ZEXT864((ulong)(*local_18 * 6.0));
        bVar1 = *local_18 * 6.0 < local_60;
        if (bVar1) {
          pdVar5 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator*(&local_68);
          local_20 = dVar6 - *pdVar5;
          __position._M_current = local_28;
          pdVar5 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator*(&local_68);
          this = (vector<double,_std::allocator<double>_> *)*pdVar5;
          pdVar5 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator*(&local_68);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = __position._M_current;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *pdVar5;
          in_ZMM1 = ZEXT864((ulong)-(double)this);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = -(double)this;
          auVar8 = vfmadd213sd_fma(auVar10,auVar14,auVar17);
          local_28 = auVar8._0_8_;
          __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
          __normal_iterator<double*>
                    ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     in_stack_ffffffffffffff38);
          std::vector<double,_std::allocator<double>_>::erase(this,__position);
        }
        in_stack_ffffffffffffff47 = false;
        local_41 = bVar1;
        if (bVar1) {
          sVar2 = std::vector<double,_std::allocator<double>_>::size(local_8);
          in_stack_ffffffffffffff47 = local_50 < sVar2;
        }
      } while ((bool)in_stack_ffffffffffffff47 != false);
    }
  }
  return;
}

Assistant:

void getDistribution( std::vector < double > & data, double & mean, double & sigma )
    {
        if( data.empty() ) {
            mean = sigma = 0;
        }
        else if( data.size() == 1u ) {
            mean = data.front();
            sigma = 0;
        }
        else {
            double sum       = 0;
            double sumSquare = 0;

            for( std::vector < double >::const_iterator v = data.begin(); v != data.end(); ++v ) {
                sum += *v;
                sumSquare += (*v) * (*v);
            }

            bool removed = false;

            const size_t sizeLimit = data.size() * 3 / 4; // remove maximum 25% of values

            do {
                // The loop removes 'biggest' element from an array in case if a difference between the value and mean is more than 6 sigma
                const uint32_t size = static_cast<uint32_t>( data.size() ); // reasonable as amount of input data cannot be so huge
                mean  = sum / size;
                sigma = sqrt( (sumSquare / size - mean * mean) * size / (size - 1) );

                double maximumValue = 0;
                std::vector < double >::iterator maximumPosition = data.begin();

                for( std::vector < double >::iterator v = data.begin(); v != data.end(); ++v ) {
                    const double value = fabs( (*v) - mean );

                    if( maximumValue < value ) {
                        maximumPosition = v;
                        maximumValue = value;
                    }
                }

                if( maximumValue > 6 * sigma ) {
                    sum = sum - (*maximumPosition);
                    sumSquare = sumSquare - (*maximumPosition) * (*maximumPosition);

                    data.erase( maximumPosition );
                    removed = true;
                }
                else {
                    removed = false;
                }
            } while( removed && (data.size() > sizeLimit) );
        }
    }